

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall
CTcSymMetaclassBase::add_prop(CTcSymMetaclassBase *this,CTcSymProp *prop,int is_static)

{
  CTcSymMetaProp *pCVar1;
  CTcSymMetaProp **ppCVar2;
  
  pCVar1 = (CTcSymMetaProp *)CTcPrsMem::alloc(G_prsmem,0x18);
  pCVar1->prop_ = prop;
  pCVar1->field_0x10 = pCVar1->field_0x10 & 0xfe | (byte)is_static & 1;
  pCVar1->nxt_ = (CTcSymMetaProp *)0x0;
  ppCVar2 = &this->prop_tail_->nxt_;
  if (this->prop_tail_ == (CTcSymMetaProp *)0x0) {
    ppCVar2 = &this->prop_head_;
  }
  *ppCVar2 = pCVar1;
  this->prop_tail_ = pCVar1;
  this->prop_cnt_ = this->prop_cnt_ + 1;
  return;
}

Assistant:

void CTcSymMetaclassBase::add_prop(class CTcSymProp *prop, int is_static)
{
    /* create a new list entry for the property */
    CTcSymMetaProp *entry = new (G_prsmem) CTcSymMetaProp(prop, is_static);
    
    /* link it at the end of our list */
    if (prop_tail_ != 0)
        prop_tail_->nxt_ = entry;
    else
        prop_head_ = entry;
    prop_tail_ = entry;

    /* count the addition */
    ++prop_cnt_;
}